

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_witness_stack_free(wally_tx_witness_stack *stack,_Bool free_parent)

{
  ulong local_20;
  size_t i;
  _Bool free_parent_local;
  wally_tx_witness_stack *stack_local;
  
  if (stack != (wally_tx_witness_stack *)0x0) {
    if (stack->items != (wally_tx_witness_item *)0x0) {
      for (local_20 = 0; local_20 < stack->num_items; local_20 = local_20 + 1) {
        if (stack->items[local_20].witness != (uchar *)0x0) {
          clear_and_free(stack->items[local_20].witness,stack->items[local_20].witness_len);
        }
      }
      clear_and_free(stack->items,stack->num_items << 4);
    }
    wally_clear(stack,0x18);
    if (free_parent) {
      wally_free(stack);
    }
  }
  return 0;
}

Assistant:

static int tx_witness_stack_free(struct wally_tx_witness_stack *stack,
                                 bool free_parent)
{
    size_t i;

    if (stack) {
        if (stack->items) {
            for (i = 0; i < stack->num_items; ++i) {
                if (stack->items[i].witness)
                    clear_and_free(stack->items[i].witness,
                                   stack->items[i].witness_len);
            }
            clear_and_free(stack->items, stack->num_items * sizeof(*stack->items));
        }
        wally_clear(stack, sizeof(*stack));
        if (free_parent)
            wally_free(stack);
    }
    return WALLY_OK;
}